

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_remove_file(filemgr *file,err_log_callback *log_callback)

{
  uint32_t uVar1;
  hash_elem *phVar2;
  filemgr *pfVar3;
  err_log_callback *in_RSI;
  filemgr *in_RDI;
  char *unaff_retaddr;
  filemgr *new_file;
  hash_elem *ret;
  memory_order in_stack_ffffffffffffffdc;
  atomic<unsigned_int> *in_stack_ffffffffffffffe0;
  
  if ((in_RDI != (filemgr *)0x0) &&
     (uVar1 = atomic_get_uint32_t(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc), uVar1 == 0))
  {
    pthread_spin_lock(&filemgr_openlock);
    phVar2 = hash_remove((hash *)in_RDI,(hash_elem *)in_RSI);
    if (phVar2 == (hash_elem *)0x0) {
      fdb_assert_die(unaff_retaddr,(char *)in_RDI,(int)((ulong)in_RSI >> 0x20),0,
                     (uint64_t)in_stack_ffffffffffffffe0);
    }
    pthread_spin_unlock(&filemgr_openlock);
    pfVar3 = filemgr_get_instance((char *)in_stack_ffffffffffffffe0);
    if (((lazy_file_deletion_enabled & 1U) == 0) ||
       ((pfVar3 != (filemgr *)0x0 && ((pfVar3->in_place_compaction & 1U) != 0)))) {
      filemgr_free_func((hash_elem *)in_RSI);
    }
    else {
      (*register_file_removal)(in_RDI,in_RSI);
    }
  }
  return;
}

Assistant:

void filemgr_remove_file(struct filemgr *file, err_log_callback *log_callback)
{
    struct hash_elem *ret;

    if (!file || atomic_get_uint32_t(&file->ref_count) > 0) {
        return;
    }

    // remove from global hash table
    spin_lock(&filemgr_openlock);
    ret = hash_remove(&hash, &file->e);
    fdb_assert(ret, ret, NULL);
    spin_unlock(&filemgr_openlock);

    struct filemgr *new_file = filemgr_get_instance(file->new_filename);

    if (!lazy_file_deletion_enabled ||
        (new_file && new_file->in_place_compaction)) {
        filemgr_free_func(&file->e);
    } else {
        register_file_removal(file, log_callback);
    }
}